

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::EssenceContainerData::Dump(EssenceContainerData *this,FILE *stream)

{
  undefined8 uVar1;
  bool bVar2;
  char *pcVar3;
  uint *puVar4;
  char local_98 [8];
  char identbuf [128];
  FILE *stream_local;
  EssenceContainerData *this_local;
  
  local_98[0] = '\0';
  identbuf._120_8_ = stream;
  if (stream == (FILE *)0x0) {
    identbuf._120_8_ = _stderr;
  }
  InterchangeObject::Dump(&this->super_InterchangeObject,(FILE *)identbuf._120_8_);
  uVar1 = identbuf._120_8_;
  pcVar3 = UMID::EncodeString(&this->LinkedPackageUID,local_98,0x80);
  fprintf((FILE *)uVar1,"  %22s = %s\n","LinkedPackageUID",pcVar3);
  bVar2 = optional_property<unsigned_int>::empty(&this->IndexSID);
  uVar1 = identbuf._120_8_;
  if (!bVar2) {
    puVar4 = optional_property<unsigned_int>::get(&this->IndexSID);
    fprintf((FILE *)uVar1,"  %22s = %d\n","IndexSID",(ulong)*puVar4);
  }
  fprintf((FILE *)identbuf._120_8_,"  %22s = %d\n","BodySID",(ulong)this->BodySID);
  return;
}

Assistant:

void
EssenceContainerData::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  InterchangeObject::Dump(stream);
  fprintf(stream, "  %22s = %s\n",  "LinkedPackageUID", LinkedPackageUID.EncodeString(identbuf, IdentBufferLen));
  if ( ! IndexSID.empty() ) {
    fprintf(stream, "  %22s = %d\n",  "IndexSID", IndexSID.get());
  }
  fprintf(stream, "  %22s = %d\n",  "BodySID", BodySID);
}